

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall
QtMWidgets::DateTimePickerPrivate::initDaysMonthYearSectionIndex(DateTimePickerPrivate *this)

{
  Type TVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  Section *pSVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  
  uVar2 = (this->super_DateTimeParser).sections.d.size;
  if ((long)uVar2 < 1) {
    iVar6 = -1;
    iVar9 = -1;
    iVar3 = -1;
  }
  else {
    pSVar5 = (this->super_DateTimeParser).sections.d.ptr;
    uVar4 = 0xffffffff;
    uVar8 = 0;
    uVar10 = 0xffffffff;
    uVar7 = 0xffffffff;
    do {
      TVar1 = pSVar5->type;
      if ((TVar1 & DaySectionMask) == NoSection) {
        if ((TVar1 & MonthSectionMask) == NoSection) {
          if ((TVar1 & YearSectionMask) != NoSection) {
            uVar4 = uVar8 & 0xffffffff;
          }
        }
        else {
          uVar10 = uVar8 & 0xffffffff;
        }
      }
      else {
        uVar7 = uVar8 & 0xffffffff;
      }
      iVar3 = (int)uVar4;
      iVar9 = (int)uVar10;
      iVar6 = (int)uVar7;
      uVar8 = uVar8 + 1;
      pSVar5 = pSVar5 + 1;
    } while (uVar2 != uVar8);
  }
  this->daysSection = iVar6;
  this->monthSection = iVar9;
  this->yearSection = iVar3;
  return;
}

Assistant:

void
DateTimePickerPrivate::initDaysMonthYearSectionIndex()
{
	int day = -1;
	int month = -1;
	int year = -1;

	for( int i = 0; i < sections.size(); ++i )
	{
		if( sections.at( i ).type & Section::DaySectionMask )
			day = i;
		else if( sections.at( i ).type & Section::MonthSectionMask )
			month = i;
		else if( sections.at( i ).type & Section::YearSectionMask )
			year = i;
	}

	daysSection = day;
	monthSection = month;
	yearSection = year;
}